

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,DiffInfo *info)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0017c280;
  DiffInfo::getProgramForOs_abi_cxx11_(&local_40,info);
  pcVar1 = (info->arguments)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (info->arguments)._M_string_length);
  CommandReporter::CommandReporter
            (&this->super_CommandReporter,&local_40,&local_60,
             &(this->launcher).super_CommandLauncher);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0017c280;
  SystemLauncher::SystemLauncher(&this->launcher,false,false);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const DiffInfo& info)
        : CommandReporter(info.getProgramForOs(), info.arguments, &launcher)
    {
    }